

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.cpp
# Opt level: O3

void doTest(TestStartupParamsAndResults *startupParams)

{
  size_t sVar1;
  ThreadTestRes *pTVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  TestStartupParamsAndResults *pTVar6;
  size_t *psVar7;
  size_t sVar8;
  char *pcVar9;
  size_t i;
  unsigned_long uVar10;
  byte bVar11;
  thread t1;
  thread threads [32];
  ThreadStartupParamsAndResults testParams [32];
  ModuleID local_f48;
  thread local_f40;
  long local_f38 [32];
  char local_e38 [104];
  long local_dd0 [436];
  
  bVar11 = 0;
  sVar1 = (startupParams->startupParams).threadCount;
  lVar5 = 0x100;
  memset(local_f38,0,0x100);
  if (sVar1 != 0) {
    pTVar2 = startupParams->testRes->threadResPerThreadAlloc;
    plVar4 = local_dd0;
    sVar8 = 0;
    do {
      pTVar6 = startupParams;
      psVar7 = (size_t *)(plVar4 + -0xd);
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *psVar7 = (pTVar6->startupParams).threadCount;
        pTVar6 = (TestStartupParamsAndResults *)((long)pTVar6 + (ulong)bVar11 * -0x10 + 8);
        psVar7 = psVar7 + (ulong)bVar11 * -2 + 1;
      }
      plVar4[-3] = sVar8;
      plVar4[-2] = (long)(pTVar2 + -0x40);
      plVar4[-1] = (long)(pTVar2 + -0x20);
      *plVar4 = (long)pTVar2;
      sVar8 = sVar8 + 1;
      pTVar2 = pTVar2 + 1;
      plVar4 = plVar4 + 0xe;
    } while (sVar1 != sVar8);
    pcVar9 = local_e38;
    uVar10 = 0;
    do {
      local_f48.str = (char *)0x0;
      nodecpp::log::default_log::log<char_const*,unsigned_long>
                (&local_f48,info,"about to run thread {}...",uVar10);
      local_f48.str = pcVar9;
      std::thread::thread<void*(&)(void*),void*,void>(&local_f40,runRandomTest,&local_f48.str);
      if (local_f38[uVar10] != 0) goto LAB_00103e1b;
      ((id *)(local_f38 + uVar10))->_M_thread = (native_handle_type)local_f40._M_id._M_thread;
      local_f40._M_id._M_thread = (id)0;
      local_f48.str = (char *)0x0;
      nodecpp::log::default_log::log<char_const*>(&local_f48,info,"    ...done");
      if (local_f40._M_id._M_thread != 0) goto LAB_00103e1b;
      uVar10 = uVar10 + 1;
      pcVar9 = pcVar9 + 0x70;
    } while (sVar1 != uVar10);
    uVar10 = 0;
    do {
      local_f48.str = (char *)0x0;
      nodecpp::log::default_log::log<char_const*,unsigned_long>
                (&local_f48,info,"joining thread {}...",uVar10);
      std::thread::join();
      local_f48.str = (char *)0x0;
      nodecpp::log::default_log::log<char_const*>(&local_f48,info,"    ...done");
      uVar10 = uVar10 + 1;
    } while (sVar1 != uVar10);
  }
  while (*(long *)((long)local_f38 + lVar5 + -8) == 0) {
    lVar5 = lVar5 + -8;
    if (lVar5 == 0) {
      return;
    }
  }
LAB_00103e1b:
  std::terminate();
}

Assistant:

void doTest( TestStartupParamsAndResults* startupParams )
{
	size_t testThreadCount = startupParams->startupParams.threadCount;

	ThreadStartupParamsAndResults testParams[max_threads];
	std::thread threads[ max_threads ];

	for ( size_t i=0; i<testThreadCount; ++i )
	{
		memcpy( testParams + i, startupParams, sizeof(TestStartupParams) );
		testParams[i].threadID = i;
		testParams[i].threadResEmpty = startupParams->testRes->threadResEmpty + i;
		testParams[i].threadResNewDel = startupParams->testRes->threadResNewDel + i;
		testParams[i].threadResPerThreadAlloc = startupParams->testRes->threadResPerThreadAlloc + i;
	}

	// run thread
	for ( size_t i=0; i<testThreadCount; ++i )
	{
		nodecpp::log::default_log::info( "about to run thread {}...", i );
		std::thread t1( runRandomTest, (void*)(testParams + i) );
		threads[i] = std::move( t1 );
//		t1.detach();
		nodecpp::log::default_log::info( "    ...done" );
	}
	// join threads
	for ( size_t i=0; i<testThreadCount; ++i )
	{
		nodecpp::log::default_log::info( "joining thread {}...", i );
		threads[i].join();
		nodecpp::log::default_log::info( "    ...done" );
	}
}